

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue_read.cpp
# Opt level: O2

ssize_t __thiscall UniValue::read(UniValue *this,int __fd,void *__buf,size_t __nbytes)

{
  uint uVar1;
  UniValue *pUVar2;
  bool bVar3;
  pointer ppUVar4;
  jtokentype jVar5;
  jtokentype jVar6;
  ulong uVar7;
  string *unaff_RBP;
  string *initialStr;
  undefined4 in_register_00000034;
  byte bVar8;
  char *raw;
  bool bVar9;
  vector<UniValue_*,_std::allocator<UniValue_*>_> stack;
  allocator local_e1;
  UniValue *local_e0;
  uint consumed;
  char *local_d0;
  string tokenVal;
  UniValue tmpVal;
  UniValue *newTop;
  
  raw = (char *)CONCAT44(in_register_00000034,__fd);
  clear(this);
  stack.super__Vector_base<UniValue_*,_std::allocator<UniValue_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tokenVal._M_dataplus._M_p = (pointer)&tokenVal.field_2;
  tokenVal._M_string_length = 0;
  stack.super__Vector_base<UniValue_*,_std::allocator<UniValue_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  stack.super__Vector_base<UniValue_*,_std::allocator<UniValue_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tokenVal.field_2._M_local_buf[0] = '\0';
  local_d0 = (char *)((long)__buf + (long)raw);
  bVar8 = 0;
  bVar3 = false;
  jVar6 = JTOK_NONE;
  local_e0 = this;
  do {
    jVar5 = getJsonToken(&tokenVal,&consumed,raw,local_d0);
    pUVar2 = local_e0;
    if ((uint)(jVar5 + JTOK_OBJ_OPEN) < 2) {
switchD_003dffe5_default:
      unaff_RBP = (string *)0x0;
      goto LAB_003e03ad;
    }
    uVar7 = (ulong)consumed;
    uVar1 = jVar5 + ~JTOK_COMMA;
    if ((bVar8 & 8) != 0) {
      if ((uVar1 < 5) || ((jVar5 | JTOK_OBJ_CLOSE) == JTOK_ARR_OPEN)) {
        bVar8 = bVar8 & 0xf7;
        goto LAB_003dff8f;
      }
      goto switchD_003dffe5_default;
    }
    if ((bVar8 & 4) != 0) {
      if (uVar1 < 5) {
        if ((bVar8 & 0x10) != 0) goto switchD_003dffe5_default;
        bVar8 = bVar8 & 0xf3;
        initialStr = unaff_RBP;
        goto LAB_003dffca;
      }
      if (((uint)jVar5 < 5) && ((0x1aU >> (jVar5 & 0x1f) & 1) != 0)) {
        bVar8 = bVar8 & 0xf3;
      }
      unaff_RBP = (string *)0x0;
      if (((uint)jVar5 < 5) && ((0x1aU >> (jVar5 & 0x1f) & 1) != 0)) goto LAB_003dff8f;
      goto LAB_003e03ad;
    }
    if (bVar3) {
      if ((jVar5 == JTOK_OBJ_CLOSE) || (jVar5 == JTOK_STRING)) goto LAB_003dff8f;
      goto switchD_003dffe5_default;
    }
    if ((bVar8 & 2) != 0) {
      if (jVar5 == JTOK_COLON) {
        bVar8 = bVar8 & 0xf0;
        bVar3 = false;
        goto LAB_003dff8f;
      }
      goto switchD_003dffe5_default;
    }
    if (jVar5 == JTOK_COLON) goto switchD_003dffe5_default;
LAB_003dff8f:
    initialStr = unaff_RBP;
    if ((bVar8 & 0x10) != 0) {
      if ((uVar1 < 5) || ((jVar5 | JTOK_OBJ_CLOSE) == JTOK_ARR_OPEN)) goto switchD_003dffe5_default;
      bVar8 = bVar8 & 0xef;
    }
LAB_003dffca:
    switch(jVar5) {
    case JTOK_OBJ_OPEN:
    case JTOK_ARR_OPEN:
      initialStr = (string *)0x0;
      if (stack.super__Vector_base<UniValue_*,_std::allocator<UniValue_*>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          stack.super__Vector_base<UniValue_*,_std::allocator<UniValue_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        if (jVar5 == JTOK_OBJ_OPEN) {
          setObject(local_e0);
        }
        else {
          setArray(local_e0);
        }
        tmpVal._0_8_ = pUVar2;
        std::vector<UniValue*,std::allocator<UniValue*>>::emplace_back<UniValue*>
                  ((vector<UniValue*,std::allocator<UniValue*>> *)&stack,(UniValue **)&tmpVal);
      }
      else {
        initialStr = (string *)&newTop;
        std::__cxx11::string::string((string *)initialStr,"",&local_e1);
        UniValue(&tmpVal,(jVar5 != JTOK_OBJ_OPEN) + VOBJ,initialStr);
        std::__cxx11::string::~string((string *)initialStr);
        pUVar2 = stack.super__Vector_base<UniValue_*,_std::allocator<UniValue_*>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1];
        std::vector<UniValue,_std::allocator<UniValue>_>::push_back(&pUVar2->values,&tmpVal);
        newTop = (pUVar2->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                 super__Vector_impl_data._M_finish + -1;
        std::vector<UniValue_*,_std::allocator<UniValue_*>_>::push_back
                  (&stack,(value_type *)initialStr);
        ~UniValue(&tmpVal);
      }
      bVar8 = bVar8 | (jVar5 != JTOK_OBJ_OPEN) * '\x03' + 1U;
      bVar3 = (bool)(bVar3 | jVar5 == JTOK_OBJ_OPEN);
      break;
    case JTOK_OBJ_CLOSE:
    case JTOK_ARR_CLOSE:
      initialStr = (string *)0x0;
      unaff_RBP = (string *)0x0;
      if ((jVar6 == JTOK_COMMA) ||
         (stack.super__Vector_base<UniValue_*,_std::allocator<UniValue_*>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          stack.super__Vector_base<UniValue_*,_std::allocator<UniValue_*>_>._M_impl.
          super__Vector_impl_data._M_start)) goto LAB_003e03ad;
      if ((jVar5 != JTOK_OBJ_CLOSE) + VOBJ !=
          stack.super__Vector_base<UniValue_*,_std::allocator<UniValue_*>_>._M_impl.
          super__Vector_impl_data._M_finish[-1]->typ) goto switchD_003dffe5_default;
      stack.super__Vector_base<UniValue_*,_std::allocator<UniValue_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           stack.super__Vector_base<UniValue_*,_std::allocator<UniValue_*>_>._M_impl.
           super__Vector_impl_data._M_finish + -1;
      bVar8 = bVar8 & 0xee | 0x10;
      bVar3 = false;
      break;
    case JTOK_COLON:
      if ((stack.super__Vector_base<UniValue_*,_std::allocator<UniValue_*>_>._M_impl.
           super__Vector_impl_data._M_finish ==
           stack.super__Vector_base<UniValue_*,_std::allocator<UniValue_*>_>._M_impl.
           super__Vector_impl_data._M_start) ||
         (stack.super__Vector_base<UniValue_*,_std::allocator<UniValue_*>_>._M_impl.
          super__Vector_impl_data._M_finish[-1]->typ != VOBJ)) goto switchD_003dffe5_default;
      bVar8 = bVar8 | 8;
      break;
    case JTOK_COMMA:
      if (stack.super__Vector_base<UniValue_*,_std::allocator<UniValue_*>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          stack.super__Vector_base<UniValue_*,_std::allocator<UniValue_*>_>._M_impl.
          super__Vector_impl_data._M_start) goto switchD_003dffe5_default;
      initialStr = (string *)0x0;
      unaff_RBP = (string *)0x0;
      if ((jVar6 == JTOK_ARR_OPEN) || (jVar6 == JTOK_COMMA)) goto LAB_003e03ad;
      bVar9 = stack.super__Vector_base<UniValue_*,_std::allocator<UniValue_*>_>._M_impl.
              super__Vector_impl_data._M_finish[-1]->typ != VOBJ;
      bVar8 = bVar8 | bVar9 * '\x03' + 1U;
      bVar3 = (bool)(bVar3 | !bVar9);
      break;
    case JTOK_KW_NULL:
    case JTOK_KW_TRUE:
    case JTOK_KW_FALSE:
      tmpVal.val._M_dataplus._M_p = (pointer)&tmpVal.val.field_2;
      tmpVal.val._M_string_length = 0;
      tmpVal.val.field_2._M_local_buf[0] = '\0';
      tmpVal._0_8_ = tmpVal._0_8_ & 0xffffffff00000000;
      tmpVal.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      tmpVal.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      tmpVal.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      tmpVal.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      tmpVal.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      tmpVal.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      if (jVar5 == JTOK_KW_FALSE) {
        bVar9 = false;
LAB_003e01b6:
        setBool(&tmpVal,bVar9);
      }
      else if (jVar5 == JTOK_KW_TRUE) {
        bVar9 = true;
        goto LAB_003e01b6;
      }
      if (stack.super__Vector_base<UniValue_*,_std::allocator<UniValue_*>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          stack.super__Vector_base<UniValue_*,_std::allocator<UniValue_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        operator=(local_e0,&tmpVal);
      }
      else {
        std::vector<UniValue,_std::allocator<UniValue>_>::push_back
                  (&stack.super__Vector_base<UniValue_*,_std::allocator<UniValue_*>_>._M_impl.
                    super__Vector_impl_data._M_finish[-1]->values,&tmpVal);
LAB_003e01dd:
        bVar8 = bVar8 | 0x10;
      }
      goto LAB_003e0345;
    case JTOK_NUMBER:
      UniValue(&tmpVal,VNUM,&tokenVal);
      if (stack.super__Vector_base<UniValue_*,_std::allocator<UniValue_*>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          stack.super__Vector_base<UniValue_*,_std::allocator<UniValue_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        std::vector<UniValue,_std::allocator<UniValue>_>::push_back
                  (&stack.super__Vector_base<UniValue_*,_std::allocator<UniValue_*>_>._M_impl.
                    super__Vector_impl_data._M_finish[-1]->values,&tmpVal);
        goto LAB_003e01dd;
      }
      operator=(local_e0,&tmpVal);
LAB_003e0345:
      ~UniValue(&tmpVal);
      break;
    case JTOK_STRING:
      if (bVar3) {
        cfd::core::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&stack.super__Vector_base<UniValue_*,_std::allocator<UniValue_*>_>._M_impl.
                        super__Vector_impl_data._M_finish[-1]->keys,(value_type *)&tokenVal);
        bVar8 = bVar8 & 0xfc | 2;
        bVar3 = false;
      }
      else {
        UniValue(&tmpVal,VSTR,&tokenVal);
        initialStr = (string *)
                     stack.super__Vector_base<UniValue_*,_std::allocator<UniValue_*>_>._M_impl.
                     super__Vector_impl_data._M_finish;
        ppUVar4 = stack.super__Vector_base<UniValue_*,_std::allocator<UniValue_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (stack.super__Vector_base<UniValue_*,_std::allocator<UniValue_*>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            stack.super__Vector_base<UniValue_*,_std::allocator<UniValue_*>_>._M_impl.
            super__Vector_impl_data._M_start) {
          operator=(local_e0,&tmpVal);
        }
        else {
          std::vector<UniValue,_std::allocator<UniValue>_>::push_back
                    (&stack.super__Vector_base<UniValue_*,_std::allocator<UniValue_*>_>._M_impl.
                      super__Vector_impl_data._M_finish[-1]->values,&tmpVal);
        }
        ~UniValue(&tmpVal);
        if (initialStr == (string *)ppUVar4) break;
      }
      bVar8 = bVar8 | 0x10;
      break;
    default:
      goto switchD_003dffe5_default;
    }
    raw = raw + uVar7;
    unaff_RBP = initialStr;
    jVar6 = jVar5;
  } while (stack.super__Vector_base<UniValue_*,_std::allocator<UniValue_*>_>._M_impl.
           super__Vector_impl_data._M_start !=
           stack.super__Vector_base<UniValue_*,_std::allocator<UniValue_*>_>._M_impl.
           super__Vector_impl_data._M_finish);
  jVar6 = getJsonToken(&tokenVal,&consumed,raw,local_d0);
  unaff_RBP = (string *)CONCAT71((int7)((ulong)initialStr >> 8),jVar6 == JTOK_NONE);
LAB_003e03ad:
  std::__cxx11::string::~string((string *)&tokenVal);
  std::_Vector_base<UniValue_*,_std::allocator<UniValue_*>_>::~_Vector_base
            (&stack.super__Vector_base<UniValue_*,_std::allocator<UniValue_*>_>);
  return (ulong)unaff_RBP & 0xffffffff;
}

Assistant:

bool UniValue::read(const char *raw, size_t size)
{
    clear();

    uint32_t expectMask = 0;
    std::vector<UniValue*> stack;

    std::string tokenVal;
    unsigned int consumed;
    enum jtokentype tok = JTOK_NONE;
    enum jtokentype last_tok = JTOK_NONE;
    const char* end = raw + size;
    do {
        last_tok = tok;

        tok = getJsonToken(tokenVal, consumed, raw, end);
        if (tok == JTOK_NONE || tok == JTOK_ERR)
            return false;
        raw += consumed;

        bool isValueOpen = jsonTokenIsValue(tok) ||
            tok == JTOK_OBJ_OPEN || tok == JTOK_ARR_OPEN;

        if (expect(VALUE)) {
            if (!isValueOpen)
                return false;
            clearExpect(VALUE);

        } else if (expect(ARR_VALUE)) {
            bool isArrValue = isValueOpen || (tok == JTOK_ARR_CLOSE);
            if (!isArrValue)
                return false;

            clearExpect(ARR_VALUE);

        } else if (expect(OBJ_NAME)) {
            bool isObjName = (tok == JTOK_OBJ_CLOSE || tok == JTOK_STRING);
            if (!isObjName)
                return false;

        } else if (expect(COLON)) {
            if (tok != JTOK_COLON)
                return false;
            clearExpect(COLON);

        } else if (!expect(COLON) && (tok == JTOK_COLON)) {
            return false;
        }

        if (expect(NOT_VALUE)) {
            if (isValueOpen)
                return false;
            clearExpect(NOT_VALUE);
        }

        switch (tok) {

        case JTOK_OBJ_OPEN:
        case JTOK_ARR_OPEN: {
            VType utyp = (tok == JTOK_OBJ_OPEN ? VOBJ : VARR);
            if (!stack.size()) {
                if (utyp == VOBJ)
                    setObject();
                else
                    setArray();
                stack.push_back(this);
            } else {
                UniValue tmpVal(utyp);
                UniValue *top = stack.back();
                top->values.push_back(tmpVal);

                UniValue *newTop = &(top->values.back());
                stack.push_back(newTop);
            }

            if (utyp == VOBJ)
                setExpect(OBJ_NAME);
            else
                setExpect(ARR_VALUE);
            break;
            }

        case JTOK_OBJ_CLOSE:
        case JTOK_ARR_CLOSE: {
            if (!stack.size() || (last_tok == JTOK_COMMA))
                return false;

            VType utyp = (tok == JTOK_OBJ_CLOSE ? VOBJ : VARR);
            UniValue *top = stack.back();
            if (utyp != top->getType())
                return false;

            stack.pop_back();
            clearExpect(OBJ_NAME);
            setExpect(NOT_VALUE);
            break;
            }

        case JTOK_COLON: {
            if (!stack.size())
                return false;

            UniValue *top = stack.back();
            if (top->getType() != VOBJ)
                return false;

            setExpect(VALUE);
            break;
            }

        case JTOK_COMMA: {
            if (!stack.size() ||
                (last_tok == JTOK_COMMA) || (last_tok == JTOK_ARR_OPEN))
                return false;

            UniValue *top = stack.back();
            if (top->getType() == VOBJ)
                setExpect(OBJ_NAME);
            else
                setExpect(ARR_VALUE);
            break;
            }

        case JTOK_KW_NULL:
        case JTOK_KW_TRUE:
        case JTOK_KW_FALSE: {
            UniValue tmpVal;
            switch (tok) {
            case JTOK_KW_NULL:
                // do nothing more
                break;
            case JTOK_KW_TRUE:
                tmpVal.setBool(true);
                break;
            case JTOK_KW_FALSE:
                tmpVal.setBool(false);
                break;
            default: /* impossible */ break;
            }

            if (!stack.size()) {
                *this = tmpVal;
                break;
            }

            UniValue *top = stack.back();
            top->values.push_back(tmpVal);

            setExpect(NOT_VALUE);
            break;
            }

        case JTOK_NUMBER: {
            UniValue tmpVal(VNUM, tokenVal);
            if (!stack.size()) {
                *this = tmpVal;
                break;
            }

            UniValue *top = stack.back();
            top->values.push_back(tmpVal);

            setExpect(NOT_VALUE);
            break;
            }

        case JTOK_STRING: {
            if (expect(OBJ_NAME)) {
                UniValue *top = stack.back();
                top->keys.push_back(tokenVal);
                clearExpect(OBJ_NAME);
                setExpect(COLON);
            } else {
                UniValue tmpVal(VSTR, tokenVal);
                if (!stack.size()) {
                    *this = tmpVal;
                    break;
                }
                UniValue *top = stack.back();
                top->values.push_back(tmpVal);
            }

            setExpect(NOT_VALUE);
            break;
            }

        default:
            return false;
        }
    } while (!stack.empty ());

    /* Check that nothing follows the initial construct (parsed above).  */
    tok = getJsonToken(tokenVal, consumed, raw, end);
    if (tok != JTOK_NONE)
        return false;

    return true;
}